

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_MinipointCounterTest_SimpleOpenQuad_Test::TEST_MinipointCounterTest_SimpleOpenQuad_Test
          (TEST_MinipointCounterTest_SimpleOpenQuad_Test *this)

{
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::TEST_GROUP_CppUTestGroupMinipointCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMinipointCounterTest_001da8c0;
  return;
}

Assistant:

TEST(MinipointCounterTest, SimpleOpenQuad)
{
	addQuad(Tile::EightOfCircles, true);
	addOpenNoPointsHandWithoutOneMeld();
	s.winByDiscard();

	CHECK_EQUAL(28, m.total(false));
}